

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

void useup(obj *obj)

{
  uint uVar1;
  
  if (1 < obj->quan) {
    obj->field_0x4c = obj->field_0x4c & 0x7f;
    obj->quan = obj->quan + -1;
    uVar1 = weight(obj);
    obj->owt = uVar1;
    update_inventory();
    return;
  }
  useupall(obj);
  return;
}

Assistant:

void useup(struct obj *obj)
{
	/*  Note:  This works correctly for containers because they */
	/*	   (containers) don't merge.			    */
	if (obj->quan > 1L) {
		obj->in_use = FALSE;	/* no longer in use */
		obj->quan--;
		obj->owt = weight(obj);
		update_inventory();
	} else {
		useupall(obj);
	}
}